

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

uint __thiscall llvm::dwarf::getVirtuality(dwarf *this,StringRef VirtualityString)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pcVar4 = VirtualityString.Data;
  uVar3 = 0;
  bVar5 = false;
  if (pcVar4 == (char *)0x12) {
    auVar7[0] = -(*this == (dwarf)'D');
    auVar7[1] = -(this[1] == (dwarf)'W');
    auVar7[2] = -(this[2] == (dwarf)'_');
    auVar7[3] = -(this[3] == (dwarf)'V');
    auVar7[4] = -(this[4] == (dwarf)'I');
    auVar7[5] = -(this[5] == (dwarf)'R');
    auVar7[6] = -(this[6] == (dwarf)'T');
    auVar7[7] = -(this[7] == (dwarf)'U');
    auVar7[8] = -(this[8] == (dwarf)'A');
    auVar7[9] = -(this[9] == (dwarf)'L');
    auVar7[10] = -(this[10] == (dwarf)'I');
    auVar7[0xb] = -(this[0xb] == (dwarf)'T');
    auVar7[0xc] = -(this[0xc] == (dwarf)'Y');
    auVar7[0xd] = -(this[0xd] == (dwarf)'_');
    auVar7[0xe] = -(this[0xe] == (dwarf)'n');
    auVar7[0xf] = -(this[0xf] == (dwarf)'o');
    auVar10[0] = -((char)*(undefined2 *)(this + 0x10) == 'n');
    auVar10[1] = -((char)((ushort)*(undefined2 *)(this + 0x10) >> 8) == 'e');
    auVar10[2] = 0xff;
    auVar10[3] = 0xff;
    auVar10[4] = 0xff;
    auVar10[5] = 0xff;
    auVar10[6] = 0xff;
    auVar10[7] = 0xff;
    auVar10[8] = 0xff;
    auVar10[9] = 0xff;
    auVar10[10] = 0xff;
    auVar10[0xb] = 0xff;
    auVar10[0xc] = 0xff;
    auVar10[0xd] = 0xff;
    auVar10[0xe] = 0xff;
    auVar10[0xf] = 0xff;
    auVar10 = auVar10 & auVar7;
    bVar5 = (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff;
  }
  bVar1 = bVar5;
  if ((pcVar4 == (char *)0x15) && (!bVar5)) {
    auVar8[0] = -(this[5] == (dwarf)'R');
    auVar8[1] = -(this[6] == (dwarf)'T');
    auVar8[2] = -(this[7] == (dwarf)'U');
    auVar8[3] = -(this[8] == (dwarf)'A');
    auVar8[4] = -(this[9] == (dwarf)'L');
    auVar8[5] = -(this[10] == (dwarf)'I');
    auVar8[6] = -(this[0xb] == (dwarf)'T');
    auVar8[7] = -(this[0xc] == (dwarf)'Y');
    auVar8[8] = -(this[0xd] == (dwarf)'_');
    auVar8[9] = -(this[0xe] == (dwarf)'v');
    auVar8[10] = -(this[0xf] == (dwarf)'i');
    auVar8[0xb] = -(this[0x10] == (dwarf)'r');
    auVar8[0xc] = -(this[0x11] == (dwarf)'t');
    auVar8[0xd] = -(this[0x12] == (dwarf)'u');
    auVar8[0xe] = -(this[0x13] == (dwarf)'a');
    auVar8[0xf] = -(this[0x14] == (dwarf)'l');
    auVar11[0] = -(*this == (dwarf)'D');
    auVar11[1] = -(this[1] == (dwarf)'W');
    auVar11[2] = -(this[2] == (dwarf)'_');
    auVar11[3] = -(this[3] == (dwarf)'V');
    auVar11[4] = -(this[4] == (dwarf)'I');
    auVar11[5] = -(this[5] == (dwarf)'R');
    auVar11[6] = -(this[6] == (dwarf)'T');
    auVar11[7] = -(this[7] == (dwarf)'U');
    auVar11[8] = -(this[8] == (dwarf)'A');
    auVar11[9] = -(this[9] == (dwarf)'L');
    auVar11[10] = -(this[10] == (dwarf)'I');
    auVar11[0xb] = -(this[0xb] == (dwarf)'T');
    auVar11[0xc] = -(this[0xc] == (dwarf)'Y');
    auVar11[0xd] = -(this[0xd] == (dwarf)'_');
    auVar11[0xe] = -(this[0xe] == (dwarf)'v');
    auVar11[0xf] = -(this[0xf] == (dwarf)'i');
    auVar11 = auVar11 & auVar8;
    bVar6 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
    uVar3 = (uint)bVar6;
    bVar1 = true;
    if (!bVar6) {
      bVar1 = bVar5;
    }
  }
  bVar5 = bVar1;
  if ((pcVar4 == (char *)0x1a) && (!bVar1)) {
    auVar12[0] = -(this[10] == (dwarf)'I');
    auVar12[1] = -(this[0xb] == (dwarf)'T');
    auVar12[2] = -(this[0xc] == (dwarf)'Y');
    auVar12[3] = -(this[0xd] == (dwarf)'_');
    auVar12[4] = -(this[0xe] == (dwarf)'p');
    auVar12[5] = -(this[0xf] == (dwarf)'u');
    auVar12[6] = -(this[0x10] == (dwarf)'r');
    auVar12[7] = -(this[0x11] == (dwarf)'e');
    auVar12[8] = -(this[0x12] == (dwarf)'_');
    auVar12[9] = -(this[0x13] == (dwarf)'v');
    auVar12[10] = -(this[0x14] == (dwarf)'i');
    auVar12[0xb] = -(this[0x15] == (dwarf)'r');
    auVar12[0xc] = -(this[0x16] == (dwarf)'t');
    auVar12[0xd] = -(this[0x17] == (dwarf)'u');
    auVar12[0xe] = -(this[0x18] == (dwarf)'a');
    auVar12[0xf] = -(this[0x19] == (dwarf)'l');
    auVar9[0] = -(*this == (dwarf)'D');
    auVar9[1] = -(this[1] == (dwarf)'W');
    auVar9[2] = -(this[2] == (dwarf)'_');
    auVar9[3] = -(this[3] == (dwarf)'V');
    auVar9[4] = -(this[4] == (dwarf)'I');
    auVar9[5] = -(this[5] == (dwarf)'R');
    auVar9[6] = -(this[6] == (dwarf)'T');
    auVar9[7] = -(this[7] == (dwarf)'U');
    auVar9[8] = -(this[8] == (dwarf)'A');
    auVar9[9] = -(this[9] == (dwarf)'L');
    auVar9[10] = -(this[10] == (dwarf)'I');
    auVar9[0xb] = -(this[0xb] == (dwarf)'T');
    auVar9[0xc] = -(this[0xc] == (dwarf)'Y');
    auVar9[0xd] = -(this[0xd] == (dwarf)'_');
    auVar9[0xe] = -(this[0xe] == (dwarf)'p');
    auVar9[0xf] = -(this[0xf] == (dwarf)'u');
    auVar9 = auVar9 & auVar12;
    bVar6 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar6) {
      uVar3 = 2;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = bVar1;
    }
  }
  uVar2 = 0xffffffff;
  if (bVar5) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

unsigned llvm::dwarf::getVirtuality(StringRef VirtualityString) {
  return StringSwitch<unsigned>(VirtualityString)
#define HANDLE_DW_VIRTUALITY(ID, NAME)                                         \
  .Case("DW_VIRTUALITY_" #NAME, DW_VIRTUALITY_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(DW_VIRTUALITY_invalid);
}